

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coveragetocsv.cpp
# Opt level: O2

void coveragetocsv::doit(bool skipheader)

{
  undefined8 in_RAX;
  size_t sVar1;
  uint uVar2;
  undefined7 in_register_00000039;
  undefined8 uStack_38;
  OASIS_FLOAT tiv;
  
  uStack_38 = in_RAX;
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    puts("coverage_id,tiv");
  }
  uVar2 = 1;
  while( true ) {
    sVar1 = fread(&tiv,4,1,_stdin);
    if (sVar1 == 0) break;
    printf("%d, %f\n",(double)tiv,(ulong)uVar2);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void doit(bool skipheader)
	{

		if(skipheader == false) printf("coverage_id,tiv\n");
		
		OASIS_FLOAT tiv;
		int id = 0;
		size_t i = fread(&tiv, sizeof(tiv), 1, stdin);
		while (i != 0) {
			id++;
			printf("%d, %f\n", id, tiv);
			i = fread(&tiv, sizeof(tiv), 1, stdin);
		}
	}